

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Synth::tick(V2Synth *this)

{
  int local_18;
  int local_14;
  int i_1;
  int i;
  V2Synth *this_local;
  
  for (local_14 = 0; local_14 < 0x40; local_14 = local_14 + 1) {
    if (-1 < this->chanmap[local_14]) {
      storeV2Values(this,local_14);
      V2Voice::tick(this->voicesw + local_14);
      if (this->voicesw[local_14].env[0].state == OFF) {
        this->chanmap[local_14] = -1;
      }
    }
  }
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    storeChanValues(this,local_18);
  }
  ronanCBTick((syWRonan *)&this->ronan);
  this->tickd = (this->instance).SRcFrameSize;
  renderFrame(this);
  return;
}

Assistant:

void tick()
    {
        // voices
        for (int i = 0; i < POLY; i++)
        {
            if (chanmap[i] < 0)
                continue;

            storeV2Values(i);
            voicesw[i].tick();

            // if EG1 finished, turn off voice
            if (voicesw[i].env[0].state == V2Env::OFF)
                chanmap[i] = -1;
        }

        // chans
        for (int i = 0; i < CHANS; i++)
            storeChanValues(i);

        ronanCBTick(&ronan);
        tickd = instance.SRcFrameSize;
        renderFrame();

#if COVERAGE
        // print coverage updates as they happen
        static int cur_frame;
        static const char *old_coverage[COUNTOF(code_coverage)];
        int ccount = synthGetNumCoverage();
        for (int i = 0; i < ccount; i++)
        {
            if (old_coverage[i] != code_coverage[i])
            {
                old_coverage[i] = code_coverage[i];
                printf("[%5d,%3d] %s\n", cur_frame, i, code_coverage[i]);
            }
        }
        cur_frame++;
#endif
    }